

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::SwapChainVkImpl::InitBuffersAndViews(SwapChainVkImpl *this)

{
  TEXTURE_FORMAT TVar1;
  undefined4 uVar2;
  VkDevice pVVar3;
  undefined4 uVar5;
  IRenderDevice *pIVar4;
  VkResult VVar6;
  uint uVar7;
  RenderDeviceVkImpl *pRVar8;
  ostream *poVar9;
  IObject *pObj;
  char (*Args_1) [18];
  char (*Args_1_00) [46];
  RefCntAutoPtr<Diligent::IRenderDevice> *this_00;
  ulong uVar10;
  uint32_t swapchainImageCount;
  RefCntAutoPtr<Diligent::TextureVkImpl> pBackBufferTex;
  RefCntAutoPtr<Diligent::ITextureView> pRTV;
  uint32_t swapchainImageCount_1;
  uint uStack_284;
  undefined8 local_280;
  Uint32 UStack_278;
  anon_union_4_2_715f406a_for_TextureDesc_4 local_274;
  TEXTURE_FORMAT local_270;
  undefined8 local_26c;
  BIND_FLAGS local_264;
  undefined2 local_260;
  MISC_TEXTURE_FLAGS local_25e;
  TEXTURE_FORMAT local_25c;
  Float32 local_258 [5];
  Uint8 local_244;
  Uint64 local_240;
  TextureViewDesc RTVDesc;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> swapchainImages;
  DoublePtrHelper<Diligent::ITextureView> local_1e8;
  string name;
  string msg;
  
  this_00 = &(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice;
  pRVar8 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>(this_00);
  pVVar3 = ((pRVar8->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_VkDevice;
  _swapchainImageCount_1 = (Char *)((ulong)uStack_284 << 0x20);
  Args_1 = (char (*) [18])0x0;
  VVar6 = (*vkGetSwapchainImagesKHR)
                    (pVVar3,this->m_VkSwapChain,&swapchainImageCount_1,(VkImage *)0x0);
  if (VVar6 != VK_SUCCESS) {
    FormatString<char[26],char[18]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"err == VK_SUCCESS",
               Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x21c);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar7 = swapchainImageCount_1;
  if (swapchainImageCount_1 !=
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount) {
    FormatString<char[35]>(&msg,(char (*) [35])"Unexpected swap chain buffer count");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x21d);
    std::__cxx11::string::~string((string *)&msg);
    uVar7 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
  ::resize(&this->m_pBackBufferRTV,(ulong)uVar7);
  std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::resize
            (&this->m_SwapChainImagesInitialized,
             (long)(this->m_pBackBufferRTV).
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_pBackBufferRTV).
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,false);
  swapchainImageCount =
       (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            (&swapchainImages,(ulong)swapchainImageCount,(allocator_type *)&msg);
  VVar6 = (*vkGetSwapchainImagesKHR)
                    (pVVar3,this->m_VkSwapChain,&swapchainImageCount,
                     swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (VVar6 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar6);
    LogError<true,char[32],char[17],char_const*>
              (false,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x227,(char (*) [32])"Failed to get swap chain images",
               (char (*) [17])"\nVK Error Code: ",(char **)&msg);
  }
  Args_1_00 = (char (*) [46])
              ((long)swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  if (Args_1_00 != (char (*) [46])(ulong)swapchainImageCount) {
    FormatString<char[26],char[46]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"swapchainImageCount == swapchainImages.size()",Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitBuffersAndViews",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x228);
    std::__cxx11::string::~string((string *)&msg);
  }
  for (uVar10 = 0; uVar10 < swapchainImageCount; uVar10 = uVar10 + 1) {
    _swapchainImageCount_1 = (Char *)0x0;
    local_280._0_4_ = (uint)local_280 & 0xffffff00;
    local_280._4_4_ = 0;
    UStack_278 = 0;
    local_274.ArraySize = 1;
    local_270 = TEX_FORMAT_UNKNOWN;
    local_26c._0_4_ = 1;
    local_26c._4_4_ = 1;
    local_264 = BIND_NONE;
    local_260._0_1_ = USAGE_DEFAULT;
    local_260._1_1_ = CPU_ACCESS_NONE;
    local_25e = MISC_TEXTURE_FLAG_NONE;
    local_25c = TEX_FORMAT_UNKNOWN;
    local_258[0] = 0.0;
    local_258[1] = 0.0;
    local_258[2] = 0.0;
    local_258[3] = 0.0;
    local_258[4] = 1.0;
    local_244 = '\0';
    local_240 = 1;
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar9 = std::operator<<((ostream *)msg.field_2._M_local_buf,"Main back buffer ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__cxx11::stringbuf::str();
    _swapchainImageCount_1 = name._M_dataplus._M_p;
    local_280._0_4_ = CONCAT31(local_280._1_3_,4);
    uVar2 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
    uVar5 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height;
    local_270 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                ColorBufferFormat;
    local_280._4_4_ = uVar2;
    UStack_278 = uVar5;
    local_264 = SwapChainUsageFlagsToBindFlags
                          ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage
                          );
    local_26c._0_4_ = 1;
    pBackBufferTex.m_pObject = (TextureVkImpl *)0x0;
    pRVar8 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>(this_00);
    RTVDesc.super_DeviceObjectAttribs.Name = (Char *)pBackBufferTex.m_pObject;
    RTVDesc._8_8_ = &pBackBufferTex;
    RenderDeviceVkImpl::CreateTexture
              (pRVar8,(TextureDesc *)&swapchainImageCount_1,
               swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar10],RESOURCE_STATE_UNDEFINED,
               (TextureVkImpl **)&RTVDesc);
    RefCntAutoPtr<Diligent::TextureVkImpl>::DoublePtrHelper<Diligent::TextureVkImpl>::
    ~DoublePtrHelper((DoublePtrHelper<Diligent::TextureVkImpl> *)&RTVDesc);
    RTVDesc.super_DeviceObjectAttribs.Name = (Char *)0x0;
    RTVDesc.NumMipLevels = 0;
    RTVDesc.field_5 = (anon_union_4_2_fd7742d7_for_TextureViewDesc_6)0x0;
    RTVDesc.field_6 = (anon_union_4_2_468fdb0b_for_TextureViewDesc_8)0x0;
    RTVDesc.AccessFlags = UAV_ACCESS_UNSPECIFIED;
    RTVDesc.Flags = TEXTURE_VIEW_FLAG_NONE;
    RTVDesc.Swizzle.R = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
    RTVDesc.Swizzle.G = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
    RTVDesc.Swizzle.B = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
    RTVDesc.Swizzle.A = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
    RTVDesc.ViewType = TEXTURE_VIEW_RENDER_TARGET;
    RTVDesc.TextureDim = RESOURCE_DIM_UNDEFINED;
    RTVDesc.Format = TEX_FORMAT_UNKNOWN;
    RTVDesc.MostDetailedMip = 0;
    pRTV.m_pObject = (ITextureView *)0x0;
    local_1e8.NewRawPtr = (ITextureView *)0x0;
    local_1e8.m_pAutoPtr = &pRTV;
    TextureBase<Diligent::EngineVkImplTraits>::CreateView
              (&(pBackBufferTex.m_pObject)->super_TextureBase<Diligent::EngineVkImplTraits>,&RTVDesc
               ,&local_1e8.NewRawPtr);
    RefCntAutoPtr<Diligent::ITextureView>::DoublePtrHelper<Diligent::ITextureView>::~DoublePtrHelper
              (&local_1e8);
    RefCntAutoPtr<Diligent::ITextureViewVk>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ITextureViewVk> *)&local_1e8,(IObject *)pRTV.m_pObject,
               (INTERFACE_ID *)IID_TextureViewVk);
    RefCntAutoPtr<Diligent::ITextureViewVk>::operator=
              ((this->m_pBackBufferRTV).
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::STDAllocator<Diligent::RefCntAutoPtr<Diligent::ITextureViewVk>,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10,
               (RefCntAutoPtr<Diligent::ITextureViewVk> *)&local_1e8);
    RefCntAutoPtr<Diligent::ITextureViewVk>::Release
              ((RefCntAutoPtr<Diligent::ITextureViewVk> *)&local_1e8);
    RefCntAutoPtr<Diligent::ITextureView>::Release(&pRTV);
    RefCntAutoPtr<Diligent::TextureVkImpl>::Release(&pBackBufferTex);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  TVar1 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.DepthBufferFormat;
  if (TVar1 != TEX_FORMAT_UNKNOWN) {
    msg.field_2._M_allocated_capacity._4_4_ = 1;
    msg._M_string_length._0_1_ = 4;
    msg._12_8_ = *(undefined8 *)&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc
    ;
    msg._M_dataplus._M_p = "Main depth buffer";
    RTVDesc.super_DeviceObjectAttribs.Name = (Char *)0x0;
    pIVar4 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice.m_pObject;
    _swapchainImageCount_1 = (pointer)0x0;
    msg.field_2._8_2_ = TVar1;
    msg.field_2._12_4_ = msg.field_2._M_allocated_capacity._4_4_;
    local_280 = &RTVDesc;
    (*(pIVar4->super_IObject)._vptr_IObject[6])(pIVar4,&msg,0);
    RefCntAutoPtr<Diligent::ITexture>::DoublePtrHelper<Diligent::ITexture>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::ITexture> *)&swapchainImageCount_1);
    pObj = (IObject *)
           (**(code **)(*(long *)RTVDesc.super_DeviceObjectAttribs.Name + 0x48))
                     (RTVDesc.super_DeviceObjectAttribs.Name,3);
    RefCntAutoPtr<Diligent::ITextureViewVk>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ITextureViewVk> *)&swapchainImageCount_1,pObj,
               (INTERFACE_ID *)IID_TextureViewVk);
    RefCntAutoPtr<Diligent::ITextureViewVk>::operator=
              (&this->m_pDepthBufferDSV,
               (RefCntAutoPtr<Diligent::ITextureViewVk> *)&swapchainImageCount_1);
    RefCntAutoPtr<Diligent::ITextureViewVk>::Release
              ((RefCntAutoPtr<Diligent::ITextureViewVk> *)&swapchainImageCount_1);
    RefCntAutoPtr<Diligent::ITexture>::Release((RefCntAutoPtr<Diligent::ITexture> *)&RTVDesc);
  }
  std::_Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~_Vector_base
            (&swapchainImages.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>);
  return;
}

Assistant:

void SwapChainVkImpl::InitBuffersAndViews()
{
    RenderDeviceVkImpl* pDeviceVkImpl   = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
    VkDevice            LogicalVkDevice = pDeviceVkImpl->GetVkDevice();

#ifdef DILIGENT_DEBUG
    {
        uint32_t swapchainImageCount = 0;
        VkResult err                 = vkGetSwapchainImagesKHR(LogicalVkDevice, m_VkSwapChain, &swapchainImageCount, NULL);
        VERIFY_EXPR(err == VK_SUCCESS);
        VERIFY(swapchainImageCount == m_SwapChainDesc.BufferCount, "Unexpected swap chain buffer count");
    }
#endif

    m_pBackBufferRTV.resize(m_SwapChainDesc.BufferCount);
    m_SwapChainImagesInitialized.resize(m_pBackBufferRTV.size(), false);

    uint32_t             swapchainImageCount = m_SwapChainDesc.BufferCount;
    std::vector<VkImage> swapchainImages(swapchainImageCount);
    VkResult             err = vkGetSwapchainImagesKHR(LogicalVkDevice, m_VkSwapChain, &swapchainImageCount, swapchainImages.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to get swap chain images");
    VERIFY_EXPR(swapchainImageCount == swapchainImages.size());

    for (uint32_t i = 0; i < swapchainImageCount; i++)
    {
        TextureDesc       BackBufferDesc;
        std::stringstream name_ss;
        name_ss << "Main back buffer " << i;
        const std::string name   = name_ss.str();
        BackBufferDesc.Name      = name.c_str();
        BackBufferDesc.Type      = RESOURCE_DIM_TEX_2D;
        BackBufferDesc.Width     = m_SwapChainDesc.Width;
        BackBufferDesc.Height    = m_SwapChainDesc.Height;
        BackBufferDesc.Format    = m_SwapChainDesc.ColorBufferFormat;
        BackBufferDesc.BindFlags = SwapChainUsageFlagsToBindFlags(m_SwapChainDesc.Usage);
        BackBufferDesc.MipLevels = 1;

        RefCntAutoPtr<TextureVkImpl> pBackBufferTex;
        m_pRenderDevice.RawPtr<RenderDeviceVkImpl>()->CreateTexture(BackBufferDesc, swapchainImages[i], RESOURCE_STATE_UNDEFINED, &pBackBufferTex);

        TextureViewDesc RTVDesc;
        RTVDesc.ViewType = TEXTURE_VIEW_RENDER_TARGET;
        RefCntAutoPtr<ITextureView> pRTV;
        pBackBufferTex->CreateView(RTVDesc, &pRTV);
        m_pBackBufferRTV[i] = RefCntAutoPtr<ITextureViewVk>(pRTV, IID_TextureViewVk);
    }

    if (m_SwapChainDesc.DepthBufferFormat != TEX_FORMAT_UNKNOWN)
    {
        TextureDesc DepthBufferDesc;
        DepthBufferDesc.Type        = RESOURCE_DIM_TEX_2D;
        DepthBufferDesc.Width       = m_SwapChainDesc.Width;
        DepthBufferDesc.Height      = m_SwapChainDesc.Height;
        DepthBufferDesc.Format      = m_SwapChainDesc.DepthBufferFormat;
        DepthBufferDesc.SampleCount = 1;
        DepthBufferDesc.Usage       = USAGE_DEFAULT;
        DepthBufferDesc.BindFlags   = BIND_DEPTH_STENCIL;

        DepthBufferDesc.ClearValue.Format               = DepthBufferDesc.Format;
        DepthBufferDesc.ClearValue.DepthStencil.Depth   = m_SwapChainDesc.DefaultDepthValue;
        DepthBufferDesc.ClearValue.DepthStencil.Stencil = m_SwapChainDesc.DefaultStencilValue;
        DepthBufferDesc.Name                            = "Main depth buffer";
        RefCntAutoPtr<ITexture> pDepthBufferTex;
        m_pRenderDevice->CreateTexture(DepthBufferDesc, nullptr, static_cast<ITexture**>(&pDepthBufferTex));
        ITextureView* pDSV = pDepthBufferTex->GetDefaultView(TEXTURE_VIEW_DEPTH_STENCIL);
        m_pDepthBufferDSV  = RefCntAutoPtr<ITextureViewVk>(pDSV, IID_TextureViewVk);
    }
}